

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall
QMetaObjectBuilder::addClassInfo(QMetaObjectBuilder *this,QByteArray *name,QByteArray *value)

{
  qsizetype qVar1;
  int iVar2;
  parameter_type in_RDI;
  int index;
  undefined4 in_stack_ffffffffffffffe0;
  
  qVar1 = QList<QByteArray>::size((QList<QByteArray> *)((in_RDI->d).ptr + 0x70));
  iVar2 = (int)qVar1;
  QList<QByteArray>::operator+=
            ((QList<QByteArray> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
  QList<QByteArray>::operator+=
            ((QList<QByteArray> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
  return iVar2;
}

Assistant:

int QMetaObjectBuilder::addClassInfo(const QByteArray &name, const QByteArray &value)
{
    int index = d->classInfoNames.size();
    d->classInfoNames += name;
    d->classInfoValues += value;
    return index;
}